

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O1

void Cnf_CollectVolume(Aig_Man_t *p,Aig_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  
  Aig_ManIncrementTravId(p);
  iVar1 = vLeaves->nSize;
  if (0 < (long)iVar1) {
    ppvVar3 = vLeaves->pArray;
    iVar2 = p->nTravIds;
    lVar4 = 0;
    do {
      *(int *)((long)ppvVar3[lVar4] + 0x20) = iVar2;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  vNodes->nSize = 0;
  Cnf_CollectVolume_rec(p,pRoot,vNodes);
  return;
}

Assistant:

void Cnf_CollectVolume( Aig_Man_t * p, Aig_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    Vec_PtrClear( vNodes );
    Cnf_CollectVolume_rec( p, pRoot, vNodes );
}